

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::egl::anon_unknown_0::PartialUpdateTest::iterate(PartialUpdateTest *this)

{
  TestContext *this_00;
  int iVar1;
  pointer pFVar2;
  pointer pFVar3;
  pointer piVar4;
  pointer piVar5;
  EGLint EVar6;
  EGLint EVar7;
  deUint32 dVar8;
  Library *egl;
  pointer pFVar9;
  pointer pFVar10;
  ostream *this_01;
  pointer *ppiVar11;
  pointer piVar12;
  undefined8 extraout_RAX;
  int **ppiVar13;
  int iVar14;
  ulong uVar15;
  int **ppiVar16;
  Frame *__args;
  Frame *extraout_RDX;
  Frame *extraout_RDX_00;
  Frame *pFVar17;
  Frame *extraout_RDX_01;
  Frame *frame;
  char *description;
  int **ppiVar18;
  ulong uVar19;
  pointer pFVar20;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *drawTypes;
  int iVar21;
  ulong uVar22;
  pointer piVar23;
  int iVar24;
  ulong uVar25;
  bool bVar26;
  float fVar27;
  float fVar28;
  EGLint currentBufferAge;
  vector<int,_std::allocator<int>_> framesOnBuffer;
  Vec4 clearColor;
  FrameSequence frameSequence;
  vector<int,_std::allocator<int>_> bufferAges;
  Frame newFrame;
  Surface refBuffer;
  Surface currentBuffer;
  Random rnd;
  ostringstream stream;
  uint local_2b4;
  int local_2b0;
  int local_2ac;
  int **local_2a8;
  int **ppiStack_2a0;
  int *local_298 [2];
  Vec4 local_288;
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  local_278;
  void *local_258;
  iterator iStack_250;
  int *local_248;
  Frame local_238;
  ulong local_218;
  ulong local_210;
  Surface local_208;
  TestLog *local_1f0;
  Functions *local_1e8;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *local_1e0;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *local_1d8;
  Surface local_1d0;
  deRandom local_1b8;
  vector<int,_std::allocator<int>_> local_1a8 [4];
  ios_base local_138 [264];
  
  deRandom_init(&local_1b8,this->m_seed);
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_1f0 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  EVar6 = eglu::querySurfaceInt(egl,this->m_eglDisplay,this->m_eglSurface,0x3057);
  EVar7 = eglu::querySurfaceInt(egl,this->m_eglDisplay,this->m_eglSurface,0x3056);
  fVar27 = deRandom_getFloat(&local_1b8);
  fVar28 = deRandom_getFloat(&local_1b8);
  local_288.m_data[2] = deRandom_getFloat(&local_1b8);
  local_288.m_data[3] = 1.0;
  local_278.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248 = (int *)0x0;
  local_258 = (void *)0x0;
  iStack_250._M_current = (int *)0x0;
  local_288.m_data[0] = fVar27;
  local_288.m_data[1] = fVar28;
  (*egl->_vptr_Library[0x30])(egl,this->m_eglDisplay,this->m_eglSurface,0x3093,0x3095);
  dVar8 = (*egl->_vptr_Library[0x1f])();
  eglu::checkError(dVar8,
                   "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                   ,499);
  local_1e8 = &this->m_gl;
  uVar25 = 0;
  local_1d8 = &this->m_oddFrameDrawType;
  local_1e0 = &this->m_evenFrameDrawType;
  local_210 = 0;
  local_218 = 0;
  local_2b0 = EVar7;
  local_2ac = EVar6;
  do {
    iVar1 = local_2ac;
    iVar24 = local_2b0;
    tcu::Surface::Surface(&local_1d0,local_2ac,local_2b0);
    tcu::Surface::Surface(&local_208,iVar1,iVar24);
    local_238.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.draws.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2b4 = 0xffffffff;
    drawTypes = local_1d8;
    if ((uVar25 & 1) == 0) {
      drawTypes = local_1e0;
    }
    local_238.width = iVar1;
    local_238.height = iVar24;
    generateRandomFrame(&local_238,drawTypes,(Random *)&local_1b8);
    pFVar3 = local_278.
             super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pFVar2 = local_278.
             super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_278.
        super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_278.
        super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      if ((long)local_278.
                super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_278.
                super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar19 = (long)local_278.
                     super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_278.
                     super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar15 = uVar19;
      if (local_278.
          super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_278.
          super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar15 = 1;
      }
      uVar22 = uVar15 + uVar19;
      if (0x3fffffffffffffe < uVar22) {
        uVar22 = 0x3ffffffffffffff;
      }
      if (CARRY8(uVar15,uVar19)) {
        uVar22 = 0x3ffffffffffffff;
      }
      if (uVar22 == 0) {
        pFVar9 = (pointer)0x0;
        pFVar17 = __args;
      }
      else {
        pFVar9 = (pointer)operator_new(uVar22 << 5);
        pFVar17 = extraout_RDX;
      }
      std::allocator_traits<std::allocator<deqp::egl::(anonymous_namespace)::Frame>>::
      construct<deqp::egl::(anonymous_namespace)::Frame,deqp::egl::(anonymous_namespace)::Frame_const&>
                ((allocator_type *)(pFVar9 + uVar19),&local_238,pFVar17);
      pFVar20 = pFVar9;
      for (pFVar10 = pFVar2; pFVar3 != pFVar10; pFVar10 = pFVar10 + 1) {
        iVar24 = pFVar10->height;
        pFVar20->width = pFVar10->width;
        pFVar20->height = iVar24;
        (pFVar20->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pFVar10->draws).
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (pFVar20->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pFVar10->draws).
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (pFVar20->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pFVar10->draws).
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pFVar10->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pFVar10->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pFVar10->draws).
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pFVar20 = pFVar20 + 1;
      }
      if (pFVar2 != (pointer)0x0) {
        operator_delete(pFVar2,(long)local_278.
                                     super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pFVar2);
      }
      local_278.
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pFVar9 + uVar22;
      local_278.
      super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
      ._M_impl.super__Vector_impl_data._M_start = pFVar9;
    }
    else {
      std::allocator_traits<std::allocator<deqp::egl::(anonymous_namespace)::Frame>>::
      construct<deqp::egl::(anonymous_namespace)::Frame,deqp::egl::(anonymous_namespace)::Frame_const&>
                ((allocator_type *)
                 local_278.
                 super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_238,__args);
      pFVar20 = pFVar3;
    }
    local_278.
    super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar20 + 1;
    (*egl->_vptr_Library[0x2b])(egl,this->m_eglDisplay,this->m_eglSurface,0x313d);
    dVar8 = (*egl->_vptr_Library[0x1f])();
    uVar15 = 0x203;
    eglu::checkError(dVar8,
                     "querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &currentBufferAge)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                     ,0x203);
    iVar24 = (int)uVar25;
    if (uVar25 < local_2b4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Fail, the age is invalid. Age: ",0x1f);
      this_01 = (ostream *)std::ostream::operator<<(local_1a8,local_2b4);
      std::__ostream_insert<char,std::char_traits<char>>(this_01,", frameNdx: ",0xc);
      std::ostream::operator<<(this_01,iVar24);
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      std::__cxx11::stringbuf::str();
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,(char *)local_2a8);
      if (local_2a8 != local_298) {
        operator_delete(local_2a8,(long)local_298[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
LAB_00e81897:
      bVar26 = false;
    }
    else {
      if (iStack_250._M_current == local_248) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_258,iStack_250,(int *)&local_2b4);
      }
      else {
        *iStack_250._M_current = local_2b4;
        iStack_250._M_current = iStack_250._M_current + 1;
      }
      if ((int)local_2b4 < 1) {
        (*egl->_vptr_Library[0x2e])(egl,this->m_eglDisplay,this->m_eglSurface,0,0);
        dVar8 = (*egl->_vptr_Library[0x1f])();
        eglu::checkError(dVar8,"setDamageRegionKHR(m_eglDisplay, m_eglSurface, NULL, 0)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                         ,0x227);
        (*(this->m_gl).clearColor)
                  (local_288.m_data[0],local_288.m_data[1],local_288.m_data[2],local_288.m_data[3]);
        (*(this->m_gl).clear)(0x4000);
      }
      else {
        if (this->m_supportBufferAge == true) {
          getDamageRegion(local_1a8,&local_238,10,10,10,10);
          piVar12 = local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          ppiVar11 = (pointer *)
                     local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          piVar23 = local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        }
        else {
          getDamageRegion(local_1a8,&local_238,0,0,0,0);
          piVar5 = local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          piVar4 = local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar12 = local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          ppiVar11 = (pointer *)
                     local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          piVar23 = local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          if (local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            ppiVar11 = (pointer *)operator_new(0x10);
            *ppiVar11 = (pointer)0x0;
            ppiVar11[1] = (pointer)0x0;
            piVar12 = (pointer)(ppiVar11 + 2);
            piVar23 = piVar12;
            if ((pointer *)piVar4 != (pointer *)0x0) {
              operator_delete(piVar4,(long)piVar5 - (long)piVar4);
            }
          }
        }
        iVar1 = (int)((ulong)((long)piVar12 - (long)ppiVar11) >> 2);
        iVar21 = iVar1 + 3;
        if (-1 < iVar1) {
          iVar21 = iVar1;
        }
        (*egl->_vptr_Library[0x2e])
                  (egl,this->m_eglDisplay,this->m_eglSurface,ppiVar11,(ulong)(uint)(iVar21 >> 2));
        dVar8 = (*egl->_vptr_Library[0x1f])();
        eglu::checkError(dVar8,
                         "setDamageRegionKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                         ,0x223);
        local_218 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        if (ppiVar11 != (pointer *)0x0) {
          operator_delete(ppiVar11,(long)piVar23 - (long)ppiVar11);
        }
      }
      iVar21 = local_2ac;
      iVar1 = local_2b0;
      if (uVar25 < 10) {
        GLES2Renderer::render(this->m_gles2Renderer,local_2ac,local_2b0,&local_238);
      }
      else {
        local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(local_1a8[0].super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,iVar24);
        local_2a8 = (int **)0x0;
        ppiStack_2a0 = (int **)0x0;
        local_298[0] = (int *)0x0;
        iVar14 = *(int *)((long)local_258 + uVar25 * 4);
        while (iVar14 != 0) {
          iVar14 = (int)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start - iVar14;
          local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start._4_4_ =
               (undefined4)
               ((ulong)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 0x20);
          local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)CONCAT44(local_1a8[0].super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start._4_4_,iVar14);
          if (ppiStack_2a0 == (int **)local_298[0]) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_2a8,(iterator)ppiStack_2a0,
                       (int *)local_1a8);
          }
          else {
            *(int *)ppiStack_2a0 = iVar14;
            ppiStack_2a0 = (int **)((long)ppiStack_2a0 + 4);
          }
          iVar14 = *(int *)((long)local_258 +
                           (long)(int)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start * 4);
        }
        ppiVar16 = (int **)((long)ppiStack_2a0 + -4);
        ppiVar18 = local_2a8;
        if (local_2a8 < ppiVar16 && local_2a8 != ppiStack_2a0) {
          do {
            ppiVar13 = (int **)((long)ppiVar18 + 4);
            iVar14 = *(int *)ppiVar18;
            *(int *)ppiVar18 = *(int *)ppiVar16;
            *(int *)ppiVar16 = iVar14;
            ppiVar16 = (int **)((long)ppiVar16 + -4);
            ppiVar18 = ppiVar13;
          } while (ppiVar13 < ppiVar16);
        }
        clearColorReference(&local_208,&local_288);
        pFVar2 = local_278.
                 super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pFVar17 = extraout_RDX_00;
        ppiVar18 = local_2a8;
        if (local_2a8 != ppiStack_2a0) {
          do {
            ReferenceRenderer::render
                      ((ReferenceRenderer *)&local_208,(Surface *)(pFVar2 + *(int *)ppiVar18),
                       pFVar17);
            ppiVar18 = (int **)((long)ppiVar18 + 4);
            pFVar17 = extraout_RDX_01;
          } while (ppiVar18 != ppiStack_2a0);
        }
        GLES2Renderer::render(this->m_gles2Renderer,iVar21,iVar1,&local_238);
        ReferenceRenderer::render((ReferenceRenderer *)&local_208,(Surface *)&local_238,frame);
        anon_unknown_0::readPixels(local_1e8,&local_1d0);
        uVar15 = uVar25 & 0xffffffff;
        bVar26 = compareToReference(local_1f0,&local_208,&local_1d0,iVar24,iVar24);
        if (bVar26) {
          if (local_2a8 != (int **)0x0) {
            operator_delete(local_2a8,(long)local_298[0] - (long)local_2a8);
          }
        }
        else {
          local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)&local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,"Fail, render result is wrong. Buffer age is ","");
          std::__cxx11::string::append((char *)local_1a8);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,
                     (char *)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
          if ((pointer *)
              local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              &local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            operator_delete(local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1a8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage + 1);
          }
          if (local_2a8 != (int **)0x0) {
            operator_delete(local_2a8,(long)local_298[0] - (long)local_2a8);
          }
          if (!bVar26) goto LAB_00e81897;
        }
      }
      (*egl->_vptr_Library[0x31])(egl,this->m_eglDisplay,this->m_eglSurface);
      dVar8 = (*egl->_vptr_Library[0x1f])();
      bVar26 = true;
      uVar15 = 0x244;
      eglu::checkError(dVar8,"swapBuffers(m_eglDisplay, m_eglSurface)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglPartialUpdateTests.cpp"
                       ,0x244);
    }
    if (local_238.draws.
        super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.draws.
                      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_238.draws.
                            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_238.draws.
                            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&local_208);
    tcu::Surface::~Surface(&local_1d0);
    if (!bVar26) break;
    bVar26 = 0x12 < uVar25;
    uVar25 = uVar25 + 1;
    local_210 = CONCAT71((int7)(uVar15 >> 8),bVar26);
  } while (uVar25 != 0x14);
  if ((local_210 & 1) != 0) {
    description = "Fail, claim to support partial_update but buffer age is always 0";
    if ((local_218 & 1) != 0) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (byte)~(byte)local_218 & QP_TEST_RESULT_FAIL,description);
  }
  if (local_258 != (void *)0x0) {
    operator_delete(local_258,(long)local_248 - (long)local_258);
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ::~vector(&local_278);
  return STOP;
}

Assistant:

TestCase::IterateResult PartialUpdateTest::iterate (void)
{
	de::Random		rnd				(m_seed);
	const Library&	egl				= m_eglTestCtx.getLibrary();
	tcu::TestLog&	log				= m_testCtx.getLog();
	const int		width			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_WIDTH);
	const int		height			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_HEIGHT);
	const float		clearRed		= rnd.getFloat();
	const float		clearGreen		= rnd.getFloat();
	const float		clearBlue		= rnd.getFloat();
	const tcu::Vec4	clearColor		(clearRed, clearGreen, clearBlue, 1.0f);
	const int		numFrames		= 20;
	FrameSequence	frameSequence;
	vector<int>		bufferAges;
	bool			hasPositiveAge  = false;

	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));

	for (int frameNdx = 0; frameNdx < numFrames; frameNdx++)
	{
		tcu::Surface	currentBuffer	 (width, height);
		tcu::Surface	refBuffer		 (width, height);
		Frame			newFrame		 (width, height);
		EGLint			currentBufferAge = -1;

		if (frameNdx % 2 == 0)
			generateRandomFrame(newFrame, m_evenFrameDrawType, rnd);
		else
			generateRandomFrame(newFrame, m_oddFrameDrawType, rnd);

		frameSequence.push_back(newFrame);

		EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &currentBufferAge));

		if (currentBufferAge > frameNdx || currentBufferAge < 0) // invalid buffer age
		{
			std::ostringstream stream;
			stream << "Fail, the age is invalid. Age: " << currentBufferAge << ", frameNdx: " << frameNdx;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, stream.str().c_str());
			return STOP;
		}

		bufferAges.push_back(currentBufferAge);
		DE_ASSERT((int)bufferAges.size() == frameNdx+1);

		if (currentBufferAge > 0)
		{
			vector<EGLint>	damageRegion;

			hasPositiveAge = true;

			if (m_supportBufferAge)
			{
				damageRegion = getDamageRegion(newFrame, 10, 10, 10, 10);
			}
			else
			{
				damageRegion = getDamageRegion(newFrame, 0, 0, 0, 0);
				// Set empty damage region to avoid invalidating the framebuffer. The damage area is invalidated
				// if the buffer age extension is not supported.
				if (damageRegion.size() == 0)
					damageRegion = vector<EGLint>(4, 0);
			}

			EGLU_CHECK_CALL(egl, setDamageRegionKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4));
		}
		else
		{
			EGLU_CHECK_CALL(egl, setDamageRegionKHR(m_eglDisplay, m_eglSurface, NULL, 0));
			clearColorScreen(m_gl, clearColor);
		}

		// during first half, just keep rendering without reading pixel back to mimic ordinary use case
		if (frameNdx < numFrames/2)
			m_gles2Renderer->render(width, height, newFrame);
		else // do verification in the second half
		{
			const vector<int> framesOnBuffer = getFramesOnBuffer(bufferAges, frameNdx);

			clearColorReference(&refBuffer, clearColor);

			for (vector<int>::const_iterator it = framesOnBuffer.begin(); it != framesOnBuffer.end(); it++)
				m_refRenderer->render(&refBuffer, frameSequence[*it]);

			m_gles2Renderer->render(width, height, newFrame);
			m_refRenderer->render(&refBuffer, newFrame);

			readPixels(m_gl, &currentBuffer);

			if (!compareToReference(log, refBuffer, currentBuffer, frameNdx, frameNdx))
			{
				string errorMessage("Fail, render result is wrong. Buffer age is ");
				errorMessage += (m_supportBufferAge ? "supported" : "not supported");
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, errorMessage.c_str());
				return STOP;
			}
		}
		EGLU_CHECK_CALL(egl, swapBuffers(m_eglDisplay, m_eglSurface));
	}

	if (!hasPositiveAge) // fraud behavior, pretend to support partial_update
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail, claim to support partial_update but buffer age is always 0");
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}